

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void int_rel_reif_real(IntVar *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  BoolView *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  IntVar *unaff_retaddr;
  BoolView b2;
  BoolView b1;
  IntVar *v;
  BoolView *in_stack_fffffffffffffdd8;
  IntVar *in_stack_fffffffffffffde0;
  FILE *__stream;
  BoolView *in_stack_fffffffffffffde8;
  BoolView *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  Lit p;
  byte local_199;
  BoolView *in_stack_fffffffffffffeb8;
  BoolView *in_stack_fffffffffffffec0;
  BoolRelType in_stack_fffffffffffffecc;
  BoolView *in_stack_fffffffffffffed0;
  undefined8 in_stack_ffffffffffffffd8;
  int v_00;
  undefined4 local_20;
  undefined4 in_stack_ffffffffffffffe4;
  
  p.x = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  v_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffde0);
  if (((bVar1) && (in_ESI == 1)) && (iVar2 = (**(code **)(*in_RDI + 0x18))(), iVar2 == 2)) {
    bVar1 = IntVar::remValNotR(in_stack_fffffffffffffde0,(int64_t)in_stack_fffffffffffffdd8);
    local_199 = 0;
    if (bVar1) {
      Reason::Reason((Reason *)&stack0xffffffffffffffe0,(Clause *)0x0);
      local_199 = (**(code **)(*in_RDI + 0x88))
                            (in_RDI,(long)in_EDX,CONCAT44(in_stack_ffffffffffffffe4,local_20),1);
      local_199 = local_199 ^ 0xff;
    }
    if ((local_199 & 1) != 0) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
  }
  else {
    iVar2 = (**(code **)(*in_RDI + 0x18))();
    if (iVar2 == 1) {
      getConstant(v_00);
      int_rel_reif(unaff_retaddr,(IntRelType)((ulong)in_RDI >> 0x20),
                   (IntVar *)CONCAT44(in_ESI,in_EDX),in_RCX,in_stack_ffffffffffffffe4);
    }
    else {
      (**(code **)(*in_RDI + 0x68))(in_RDI,(long)in_EDX,2);
      BoolView::BoolView(in_stack_fffffffffffffe18,p);
      (**(code **)(*in_RDI + 0x68))(in_RDI,(long)in_EDX,3);
      BoolView::BoolView(in_stack_fffffffffffffe18,p);
      switch(in_ESI) {
      case 0:
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        bool_rel(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        BoolView::~BoolView((BoolView *)0x277dea);
        BoolView::~BoolView((BoolView *)0x277df7);
        BoolView::~BoolView((BoolView *)0x277e04);
        break;
      case 1:
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        operator~(in_stack_fffffffffffffde8);
        bool_rel(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        BoolView::~BoolView((BoolView *)0x277ebb);
        BoolView::~BoolView((BoolView *)0x277ec8);
        BoolView::~BoolView((BoolView *)0x277ed5);
        break;
      case 2:
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        bool_rel(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        BoolView::~BoolView((BoolView *)0x277fa5);
        BoolView::~BoolView((BoolView *)0x277fb2);
        BoolView::~BoolView((BoolView *)0x277fbf);
        break;
      case 3:
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        operator~(in_stack_fffffffffffffde8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        bool_rel(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        BoolView::~BoolView((BoolView *)0x278077);
        BoolView::~BoolView((BoolView *)0x278084);
        BoolView::~BoolView((BoolView *)0x278091);
        break;
      case 4:
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        bool_rel(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        BoolView::~BoolView((BoolView *)0x278161);
        BoolView::~BoolView((BoolView *)0x27816e);
        BoolView::~BoolView((BoolView *)0x27817b);
        break;
      case 5:
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        operator~(in_stack_fffffffffffffde8);
        BoolView::BoolView((BoolView *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        bool_rel(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
        BoolView::~BoolView((BoolView *)0x278233);
        BoolView::~BoolView((BoolView *)0x278240);
        BoolView::~BoolView((BoolView *)0x27824d);
        break;
      default:
        __stream = _stderr;
        pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
          ;
        }
        else {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                           ,0x2f);
          pcVar3 = pcVar3 + 1;
        }
        fprintf(__stream,"%s:%d: ",pcVar3,0x1dc);
        fprintf(_stderr,"Assertion failed.\n");
        abort();
      }
      BoolView::~BoolView((BoolView *)0x27833e);
      BoolView::~BoolView((BoolView *)0x27834b);
    }
  }
  return;
}

Assistant:

void int_rel_reif_real(IntVar* x, IntRelType t, int c, BoolView r) {
	if (r.isTrue() && t == IRT_NE && x->getType() == INT_VAR_EL) {
		TL_SET(x, remVal, c);
		return;
	}
	if (x->getType() == INT_VAR) {
		assert(!so.lazy);
		IntVar* v = getConstant(c);
		int_rel_reif(x, t, v, r);
		return;
	}
	const BoolView b1(x->getLit(c, LR_GE));
	const BoolView b2(x->getLit(c, LR_LE));
	switch (t) {
		case IRT_EQ:
			bool_rel(b1, BRT_AND, b2, r);
			break;
		case IRT_NE:
			bool_rel(b1, BRT_AND, b2, ~r);
			break;
		case IRT_LE:
			bool_rel(b2, BRT_EQ, r);
			break;
		case IRT_LT:
			bool_rel(b1, BRT_EQ, ~r);
			break;
		case IRT_GE:
			bool_rel(b1, BRT_EQ, r);
			break;
		case IRT_GT:
			bool_rel(b2, BRT_EQ, ~r);
			break;
		default:
			NEVER;
	}
}